

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteSmv.c
# Opt level: O0

int Io_WriteSmvOne(FILE *pFile,Abc_Ntk_t *pNtk)

{
  FILE *pFile_00;
  int iVar1;
  Abc_Obj_t *pAVar2;
  ProgressBar *p;
  void *pvVar3;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  char *n;
  int Reset;
  int i;
  Abc_Obj_t *pNode;
  ProgressBar *pProgress;
  Abc_Ntk_t *pNtk_local;
  FILE *pFile_local;
  
  fprintf((FILE *)pFile,"MODULE main\n");
  fprintf((FILE *)pFile,"\n");
  fprintf((FILE *)pFile,"VAR  -- inputs\n");
  for (n._4_4_ = 0; iVar1 = Abc_NtkPiNum(pNtk), n._4_4_ < iVar1; n._4_4_ = n._4_4_ + 1) {
    pAVar2 = Abc_NtkPi(pNtk,n._4_4_);
    pAVar2 = Abc_ObjFanout0(pAVar2);
    pcVar5 = Abc_ObjName(pAVar2);
    pcVar5 = cleanUNSAFE(pcVar5);
    fprintf((FILE *)pFile,"    %s : boolean;\n",pcVar5);
  }
  fprintf((FILE *)pFile,"\n");
  fprintf((FILE *)pFile,"VAR  -- state variables\n");
  for (n._4_4_ = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), n._4_4_ < iVar1; n._4_4_ = n._4_4_ + 1) {
    pAVar2 = Abc_NtkBox(pNtk,n._4_4_);
    iVar1 = Abc_ObjIsLatch(pAVar2);
    if (iVar1 != 0) {
      pAVar2 = Abc_ObjFanout0(pAVar2);
      pAVar2 = Abc_ObjFanout0(pAVar2);
      pcVar5 = Abc_ObjName(pAVar2);
      pcVar5 = cleanUNSAFE(pcVar5);
      fprintf((FILE *)pFile,"    %s : boolean;\n",pcVar5);
    }
  }
  fprintf((FILE *)pFile,"\n");
  fprintf((FILE *)pFile,"DEFINE\n");
  pFile_00 = _stdout;
  iVar1 = Abc_NtkObjNumMax(pNtk);
  p = Extra_ProgressBarStart(pFile_00,iVar1);
  for (n._4_4_ = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), n._4_4_ < iVar1; n._4_4_ = n._4_4_ + 1) {
    pAVar2 = Abc_NtkObj(pNtk,n._4_4_);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar2), iVar1 != 0)) {
      Extra_ProgressBarUpdate(p,n._4_4_,(char *)0x0);
      Io_WriteSmvOneNode(pFile,pAVar2);
    }
  }
  Extra_ProgressBarStop(p);
  fprintf((FILE *)pFile,"\n");
  fprintf((FILE *)pFile,"ASSIGN\n");
  n._4_4_ = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vBoxes);
    if (iVar1 <= n._4_4_) {
      fprintf((FILE *)pFile,"\n");
      for (n._4_4_ = 0; iVar1 = Abc_NtkPoNum(pNtk), n._4_4_ < iVar1; n._4_4_ = n._4_4_ + 1) {
        pAVar2 = Abc_NtkPo(pNtk,n._4_4_);
        pAVar2 = Abc_ObjFanin0(pAVar2);
        pcVar5 = Abc_ObjName(pAVar2);
        pcVar5 = cleanUNSAFE(pcVar5);
        iVar1 = hasPrefix("assume_fair_",pcVar5);
        if (iVar1 == 0) {
          iVar1 = hasPrefix("Assert_",pcVar5);
          if ((iVar1 == 0) && (iVar1 = hasPrefix("assert_safety_",pcVar5), iVar1 == 0)) {
            iVar1 = hasPrefix("assert_fair_",pcVar5);
            if (iVar1 != 0) {
              fprintf((FILE *)pFile,"LTLSPEC G F %s;\n",pcVar5);
            }
          }
          else {
            fprintf((FILE *)pFile,"INVARSPEC %s;\n",pcVar5);
          }
        }
        else {
          fprintf((FILE *)pFile,"FAIRNESS %s;\n",pcVar5);
        }
      }
      return 1;
    }
    pAVar2 = Abc_NtkBox(pNtk,n._4_4_);
    iVar1 = Abc_ObjIsLatch(pAVar2);
    if (iVar1 != 0) {
      pvVar3 = Abc_ObjData(pAVar2);
      iVar1 = (int)pvVar3;
      if (iVar1 < 1) {
        __assert_fail("Reset >= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioWriteSmv.c"
                      ,0x99,"int Io_WriteSmvOne(FILE *, Abc_Ntk_t *)");
      }
      if (3 < iVar1) {
        __assert_fail("Reset <= 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioWriteSmv.c"
                      ,0x9a,"int Io_WriteSmvOne(FILE *, Abc_Ntk_t *)");
      }
      if (iVar1 != 3) {
        pAVar4 = Abc_ObjFanout0(pAVar2);
        pAVar4 = Abc_ObjFanout0(pAVar4);
        pcVar5 = Abc_ObjName(pAVar4);
        pcVar5 = cleanUNSAFE(pcVar5);
        fprintf((FILE *)pFile,"    init(%s) := %d;\n",pcVar5,(ulong)(iVar1 - 1));
      }
      pAVar4 = Abc_ObjFanout0(pAVar2);
      pAVar4 = Abc_ObjFanout0(pAVar4);
      pcVar5 = Abc_ObjName(pAVar4);
      pcVar5 = cleanUNSAFE(pcVar5);
      fprintf((FILE *)pFile,"    next(%s) := ",pcVar5);
      pAVar2 = Abc_ObjFanin0(pAVar2);
      pAVar2 = Abc_ObjFanin0(pAVar2);
      pcVar5 = Abc_ObjName(pAVar2);
      pcVar5 = cleanUNSAFE(pcVar5);
      fprintf((FILE *)pFile,"%s;\n",pcVar5);
    }
    n._4_4_ = n._4_4_ + 1;
  } while( true );
}

Assistant:

int Io_WriteSmvOne( FILE * pFile, Abc_Ntk_t * pNtk )
{
    ProgressBar * pProgress;
    Abc_Obj_t * pNode;
    int i;

    // write the PIs/POs/latches
    fprintf( pFile, "MODULE main\n");   // nusmv needs top module to be main
    fprintf ( pFile, "\n" );

    fprintf( pFile, "VAR  -- inputs\n");
    Abc_NtkForEachPi( pNtk, pNode, i )
        fprintf( pFile, "    %s : boolean;\n", 
                cleanUNSAFE(Abc_ObjName(Abc_ObjFanout0(pNode))) );
    fprintf ( pFile, "\n" );

    fprintf( pFile, "VAR  -- state variables\n");
    Abc_NtkForEachLatch( pNtk, pNode, i )
        fprintf( pFile, "    %s : boolean;\n", 
                cleanUNSAFE(Abc_ObjName(Abc_ObjFanout0(Abc_ObjFanout0(pNode)))) ); 
    fprintf ( pFile, "\n" );

    // No outputs needed for NuSMV: 
    // TODO: Add sepcs by recognizing assume_.* and assert_.*
    //
    // Abc_NtkForEachPo( pNtk, pNode, i )
    //    fprintf( pFile, "OUTPUT(%s)\n", Abc_ObjName(Abc_ObjFanin0(pNode)) );
    
    // write internal nodes
    fprintf( pFile, "DEFINE\n");
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        Io_WriteSmvOneNode( pFile, pNode );
    }
    Extra_ProgressBarStop( pProgress );
    fprintf ( pFile, "\n" );

    fprintf( pFile, "ASSIGN\n");
    Abc_NtkForEachLatch( pNtk, pNode, i )
    {
        int Reset = (int)(ABC_PTRUINT_T)Abc_ObjData( pNode );
        assert (Reset >= 1);
        assert (Reset <= 3);

        if (Reset != 3)
        {
            fprintf( pFile, "    init(%s) := %d;\n", 
                cleanUNSAFE(Abc_ObjName(Abc_ObjFanout0(Abc_ObjFanout0(pNode)))),
                Reset - 1); 
        }
        fprintf( pFile, "    next(%s) := ", 
                cleanUNSAFE(Abc_ObjName(Abc_ObjFanout0(Abc_ObjFanout0(pNode)))) ); 
        fprintf( pFile, "%s;\n", 
                cleanUNSAFE(Abc_ObjName(Abc_ObjFanin0(Abc_ObjFanin0(pNode)))) );
    }
      
    fprintf ( pFile, "\n" );
    Abc_NtkForEachPo( pNtk, pNode, i )
    {
        const char *n = cleanUNSAFE(Abc_ObjName(Abc_ObjFanin0(pNode)));
        // fprintf( pFile, "-- output %s;\n", n );
        if (hasPrefix("assume_fair_", n))
        {
            fprintf( pFile, "FAIRNESS %s;\n", n );
        }
        else if (hasPrefix("Assert_", n) || 
                hasPrefix("assert_safety_", n))
        {
            fprintf( pFile, "INVARSPEC %s;\n", n );
        }
        else if (hasPrefix("assert_fair_", n))
        {
            fprintf( pFile, "LTLSPEC G F %s;\n", n );
        }
    }

    return 1;
}